

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVode(void *cvode_mem,realtype tout,N_Vector yout,realtype *tret,int itask)

{
  N_Vector *Y;
  realtype *a;
  double *pdVar1;
  undefined8 uVar2;
  uint uVar3;
  N_Vector z;
  CVodeProjMem proj_mem;
  bool bVar4;
  int sign_1;
  int iVar5;
  int iVar6;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  void *pvVar12;
  undefined8 *puVar13;
  double *pdVar14;
  int iVar15;
  realtype *prVar16;
  long *plVar17;
  ulong uVar18;
  ulong uVar19;
  SUNNonlinearSolver NLS;
  undefined8 *puVar20;
  undefined1 *puVar21;
  N_Vector p_Var22;
  char *pcVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  realtype rVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 extraout_XMM0_Qb;
  realtype sum_2;
  double dVar31;
  double dVar32;
  realtype sum;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  realtype sum_1;
  double dVar40;
  int iVar43;
  int iVar44;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int npf;
  realtype ssmax [4];
  long nni_inc;
  realtype rav [4];
  realtype sigsq [4];
  realtype qkr [4];
  realtype vrat [5];
  realtype sqmx [4];
  realtype rrc [4];
  realtype smax [4];
  realtype qjk [4] [4];
  double adStack_768 [46];
  double adStack_5f8 [65];
  undefined8 uStack_3f0;
  int local_3e4;
  realtype local_3e0;
  N_Vector local_3d8;
  realtype *local_3d0;
  ulong local_3c8;
  int local_3bc;
  undefined1 local_3b8 [16];
  double local_3a8;
  double dStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  int local_384;
  ulong local_380;
  long local_378;
  realtype *local_370;
  long local_368;
  long local_360;
  undefined8 *local_358;
  void *local_350;
  double adStack_348 [4];
  double local_328;
  double local_320 [4];
  double local_300 [4];
  double local_2e0 [4];
  undefined8 local_2c0 [3];
  double adStack_2a8 [5];
  double local_280 [4];
  double local_260 [4];
  double local_240 [3];
  double adStack_228 [4];
  long local_208 [5];
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double adStack_1c0 [21];
  double adStack_118 [4];
  double adStack_f8 [5];
  double local_d0 [3];
  undefined8 auStack_b8 [5];
  undefined1 local_90 [96];
  undefined1 auVar38 [16];
  
  if (cvode_mem == (void *)0x0) {
    pcVar8 = "CVode";
    pcVar23 = "cvode_mem = NULL illegal.";
    iVar6 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar5 = -0x15;
    goto LAB_0040226c;
  }
  if (*(int *)((long)cvode_mem + 0x464) == 0) {
    pcVar8 = "CVode";
    pcVar23 = "Attempt to call before CVodeInit.";
    iVar6 = -0x17;
    iVar5 = -0x17;
    goto LAB_0040226c;
  }
  *(N_Vector *)((long)cvode_mem + 0xd0) = yout;
  if (yout == (N_Vector)0x0) {
    pcVar8 = "CVode";
    pcVar23 = "yout = NULL illegal.";
  }
  else if (tret == (realtype *)0x0) {
    pcVar8 = "CVode";
    pcVar23 = "tret = NULL illegal.";
  }
  else if (itask - 3U < 0xfffffffe) {
    pcVar8 = "CVode";
    pcVar23 = "Illegal value for itask.";
  }
  else {
    if (itask == 1) {
      *(realtype *)((long)cvode_mem + 0x5c0) = tout;
    }
    *(int *)((long)cvode_mem + 0x5d0) = itask;
    lVar9 = *(long *)((long)cvode_mem + 0x358);
    if (lVar9 != 0) {
LAB_004022ac:
      local_3e0 = tout;
      if (lVar9 < 1) goto LAB_00402684;
      auVar36._0_8_ =
           (ABS(*(double *)((long)cvode_mem + 0x140)) + ABS(*(double *)((long)cvode_mem + 0x168))) *
           *(double *)((long)cvode_mem + 8) * 100.0;
      auVar36._8_8_ = 0;
      if (0 < *(int *)((long)cvode_mem + 0x578)) {
        iVar6 = *(int *)((long)cvode_mem + 0x5d4);
        uStack_3f0 = 0x402311;
        local_3b8 = auVar36;
        iVar5 = cvRcheck2((CVodeMem)cvode_mem);
        if (iVar5 == -0xc) {
          pcVar8 = "cvRcheck2";
LAB_004024a8:
          pcVar23 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
          iVar6 = -0xc;
          iVar5 = -0xc;
          goto LAB_004025b8;
        }
        if (iVar5 == 1) {
LAB_00404a8c:
          rVar28 = *(realtype *)((long)cvode_mem + 0x590);
          *tret = rVar28;
LAB_00404a99:
          *(realtype *)((long)cvode_mem + 0x170) = rVar28;
          return 2;
        }
        if (iVar5 == 3) {
          pcVar8 = "cvRcheck2";
          pcVar23 = "Root found at and very near t = %lg.";
          iVar6 = -0x16;
          iVar5 = -0x16;
          goto LAB_004025b8;
        }
        auVar36._0_8_ = (double)local_3b8._0_8_;
        if ((double)local_3b8._0_8_ <
            ABS(*(double *)((long)cvode_mem + 0x168) - *(double *)((long)cvode_mem + 0x170))) {
          uStack_3f0 = 0x4024ed;
          iVar5 = cvRcheck3((CVodeMem)cvode_mem);
          if (iVar5 == -0xc) {
LAB_00404a67:
            pcVar8 = "cvRcheck3";
            goto LAB_004024a8;
          }
          if (iVar5 == 1) {
            *(undefined4 *)((long)cvode_mem + 0x5d4) = 1;
            goto LAB_00404a8c;
          }
          auVar36._0_8_ = local_3b8._0_8_;
          if (((iVar5 == 0) && (*(undefined4 *)((long)cvode_mem + 0x5d4) = 0, itask == 2)) &&
             (iVar6 == 1)) {
            rVar28 = *(realtype *)((long)cvode_mem + 0x168);
            *tret = rVar28;
            *(realtype *)((long)cvode_mem + 0x170) = rVar28;
            goto LAB_004025e7;
          }
        }
      }
      dVar33 = *(double *)((long)cvode_mem + 0x168);
      if (itask == 1) {
        if (0.0 <= (dVar33 - local_3e0) * *(double *)((long)cvode_mem + 0x140)) {
          *tret = local_3e0;
          *(realtype *)((long)cvode_mem + 0x170) = local_3e0;
          uStack_3f0 = 0x402588;
          iVar6 = CVodeGetDky(cvode_mem,local_3e0,0,yout);
          if (iVar6 == 0) {
            return 0;
          }
          pcVar8 = "CVode";
          pcVar23 = 
          "Trouble interpolating at tout = %lg. tout too far back in direction of integration";
          iVar6 = -0x16;
          iVar5 = -0x16;
LAB_004025b8:
          uStack_3f0 = 0x4025bf;
          cvProcessError((CVodeMem)cvode_mem,iVar5,"CVODE",pcVar8,pcVar23);
          return iVar6;
        }
      }
      else if (auVar36._0_8_ < ABS(dVar33 - *(double *)((long)cvode_mem + 0x170))) {
        *tret = dVar33;
        *(double *)((long)cvode_mem + 0x170) = dVar33;
LAB_004025e7:
        uStack_3f0 = 0x4025fb;
        N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),yout);
        return 0;
      }
      if (*(int *)((long)cvode_mem + 0x110) != 0) {
        dVar32 = *(double *)((long)cvode_mem + 0x118);
        if (ABS(dVar33 - dVar32) <= auVar36._0_8_) {
          uStack_3f0 = 0x4048b1;
          iVar6 = CVodeGetDky(cvode_mem,dVar32,0,yout);
          rVar28 = *(realtype *)((long)cvode_mem + 0x118);
          if (iVar6 == 0) {
            *tret = rVar28;
LAB_004049a5:
            *(realtype *)((long)cvode_mem + 0x170) = rVar28;
            *(undefined4 *)((long)cvode_mem + 0x110) = 0;
            return 1;
          }
LAB_004048c9:
          uStack_3f0 = 0x4048f2;
          cvProcessError((CVodeMem)cvode_mem,-0x16,"CVODE","CVode",
                         "The value tstop = %lg is behind current t = %lg in the direction of integration."
                        );
          return -0x16;
        }
        if (0.0 < ((*(double *)((long)cvode_mem + 0x148) + dVar33) - dVar32) *
                  *(double *)((long)cvode_mem + 0x140)) {
          auVar36._0_8_ = (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) * (dVar32 - dVar33);
          *(double *)((long)cvode_mem + 0x148) = auVar36._0_8_;
          *(double *)((long)cvode_mem + 0x158) =
               auVar36._0_8_ / *(double *)((long)cvode_mem + 0x140);
        }
      }
LAB_00402684:
      Y = (N_Vector *)((long)cvode_mem + 0x60);
      a = (realtype *)((long)cvode_mem + 0x218);
      local_350 = (void *)((long)cvode_mem + 0x228);
      local_370 = (realtype *)((long)cvode_mem + 0x600);
      local_358 = (undefined8 *)((long)cvode_mem + 0x548);
      local_360 = (long)cvode_mem + 0x4c8;
      local_368 = (long)cvode_mem + 0x4e8;
      local_378 = 0;
      local_3d0 = tret;
      local_380 = (ulong)(uint)itask;
LAB_004026ea:
      *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x140);
      *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x120);
      if (0 < *(long *)((long)cvode_mem + 0x358)) {
        uStack_3f0 = 0x402722;
        iVar6 = (**(code **)((long)cvode_mem + 0x48))
                          (*(undefined8 *)((long)cvode_mem + 0x60),
                           *(undefined8 *)((long)cvode_mem + 200),
                           *(undefined8 *)((long)cvode_mem + 0x50));
        if (iVar6 != 0) {
          pcVar8 = "At t = %lg, a component of ewt has become <= 0.";
          if (*(int *)((long)cvode_mem + 0x24) == 3) {
            pcVar8 = "At t = %lg, the user-provide EwtSet function failed.";
          }
          iVar6 = -0x16;
          iVar5 = -0x16;
          goto LAB_00404ae4;
        }
      }
      if (*(long *)((long)cvode_mem + 0x2d0) <= local_378 && 0 < *(long *)((long)cvode_mem + 0x2d0))
      {
        pcVar8 = "At t = %lg, mxstep steps taken before reaching tout.";
        iVar6 = -1;
        iVar5 = -1;
LAB_00404ae4:
        uStack_3f0 = 0x404aeb;
        cvProcessError((CVodeMem)cvode_mem,iVar5,"CVODE","CVode",pcVar8);
        rVar28 = *(realtype *)((long)cvode_mem + 0x168);
        *local_3d0 = rVar28;
        *(realtype *)((long)cvode_mem + 0x170) = rVar28;
        p_Var22 = *(N_Vector *)((long)cvode_mem + 0x60);
LAB_00404996:
        uStack_3f0 = 0x40499b;
        N_VScale(1.0,p_Var22,yout);
        return iVar6;
      }
      uStack_3f0 = 0x402757;
      rVar28 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0x60),
                           *(N_Vector *)((long)cvode_mem + 200));
      auVar36._0_8_ = rVar28 * *(double *)((long)cvode_mem + 8);
      *(double *)((long)cvode_mem + 0x450) = auVar36._0_8_;
      if (1.0 < auVar36._0_8_) {
        uStack_3f0 = 0x404a21;
        cvProcessError((CVodeMem)cvode_mem,-2,"CVODE","CVode",
                       "At t = %lg, too much accuracy requested.",
                       *(undefined8 *)((long)cvode_mem + 0x168));
        rVar28 = *(realtype *)((long)cvode_mem + 0x168);
        *local_3d0 = rVar28;
        *(realtype *)((long)cvode_mem + 0x170) = rVar28;
        uStack_3f0 = 0x404a4e;
        N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),yout);
        *(double *)((long)cvode_mem + 0x450) =
             *(double *)((long)cvode_mem + 0x450) + *(double *)((long)cvode_mem + 0x450);
        return -2;
      }
      uVar26 = 0;
      *(undefined8 *)((long)cvode_mem + 0x450) = 0x3ff0000000000000;
      auVar36._0_8_ = *(double *)((long)cvode_mem + 0x168);
      dVar33 = auVar36._0_8_ + *(double *)((long)cvode_mem + 0x140);
      if ((dVar33 == auVar36._0_8_) && (!NAN(dVar33) && !NAN(auVar36._0_8_))) {
        uVar3 = *(uint *)((long)cvode_mem + 0x2d8);
        iVar6 = *(int *)((long)cvode_mem + 0x390);
        uVar7 = iVar6 + 1;
        *(uint *)((long)cvode_mem + 0x390) = uVar7;
        if (iVar6 < (int)uVar3) {
          uStack_3f0 = 0x4027e0;
          cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                         "Internal t = %lg and h = %lg are such that t + h = t on the next step. The solver will continue anyway."
                        );
          uVar3 = *(uint *)((long)cvode_mem + 0x2d8);
          uVar7 = *(uint *)((long)cvode_mem + 0x390);
        }
        uVar26 = (ulong)uVar3;
        if (uVar7 == uVar3) {
          uStack_3f0 = 0x402814;
          cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                         "The above warning has been issued mxhnil times and will not be issued again for this problem."
                        );
          uVar26 = extraout_RAX;
        }
      }
      local_384 = 0;
      if (0 < *(long *)((long)cvode_mem + 0x358)) {
        if ((*(double *)((long)cvode_mem + 0x148) != *(double *)((long)cvode_mem + 0x140)) ||
           (NAN(*(double *)((long)cvode_mem + 0x148)) || NAN(*(double *)((long)cvode_mem + 0x140))))
        {
          iVar6 = *(int *)((long)cvode_mem + 0x124) - *(int *)((long)cvode_mem + 0x120);
          if (iVar6 != 0) {
            uStack_3f0 = 0x402850;
            cvAdjustOrder((CVodeMem)cvode_mem,iVar6);
            *(int *)((long)cvode_mem + 0x120) = *(int *)((long)cvode_mem + 0x124);
            iVar6 = *(int *)((long)cvode_mem + 0x124) + 1;
            *(int *)((long)cvode_mem + 0x130) = iVar6;
            *(int *)((long)cvode_mem + 300) = iVar6;
          }
          uStack_3f0 = 0x402872;
          cvRescale((CVodeMem)cvode_mem);
          uVar26 = extraout_RAX_00;
        }
      }
      local_398 = (double)CONCAT44(local_398._4_4_,(int)CONCAT71((int7)(uVar26 >> 8),1));
      if (*(int *)((long)cvode_mem + 0x5f8) != 0) {
        lVar9 = *(long *)((long)cvode_mem + 0x5f0);
        if (0 < *(long *)(lVar9 + 0x10)) {
          if (*(long *)((long)cvode_mem + 0x358) == 0) {
            local_398 = (double)((ulong)local_398._4_4_ << 0x20);
          }
          else {
            local_398 = (double)CONCAT44(local_398._4_4_,
                                         (int)CONCAT71((int7)((ulong)lVar9 >> 8),
                                                       *(long *)((long)cvode_mem + 0x358) <
                                                       *(long *)(lVar9 + 0x10) +
                                                       *(long *)(lVar9 + 0x18)));
          }
        }
      }
      local_3b8._0_8_ = *(undefined8 *)((long)cvode_mem + 0x168);
      local_3e4 = 6;
      local_3bc = 0;
      local_3c8 = 0;
      local_3d8 = yout;
LAB_004028e1:
      auVar36._0_8_ = *(double *)((long)cvode_mem + 0x168) + *(double *)((long)cvode_mem + 0x140);
      *(double *)((long)cvode_mem + 0x168) = auVar36._0_8_;
      if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
         (0.0 < *(double *)((long)cvode_mem + 0x140) *
                (auVar36._0_8_ - *(double *)((long)cvode_mem + 0x118)))) {
        *(double *)((long)cvode_mem + 0x168) = *(double *)((long)cvode_mem + 0x118);
      }
      uVar26 = (ulong)*(uint *)((long)cvode_mem + 0x120);
      if (0 < (int)*(uint *)((long)cvode_mem + 0x120)) {
        lVar9 = 1;
        do {
          lVar24 = (long)(int)uVar26;
          do {
            p_Var22 = *(N_Vector *)((long)cvode_mem + lVar24 * 8 + 0x58);
            uStack_3f0 = 0x40295f;
            N_VLinearSum(1.0,p_Var22,1.0,Y[lVar24],p_Var22);
            bVar4 = lVar9 < lVar24;
            lVar24 = lVar24 + -1;
          } while (bVar4);
          uVar26 = (ulong)*(int *)((long)cvode_mem + 0x120);
          bVar4 = lVar9 < (long)uVar26;
          lVar9 = lVar9 + 1;
        } while (bVar4);
      }
      iVar6 = (int)uVar26;
      if (*(int *)((long)cvode_mem + 0x20) == 2) {
        *a = 1.0;
        *(undefined8 *)((long)cvode_mem + 0x220) = 0x3ff0000000000000;
        if (1 < iVar6) {
          uStack_3f0 = 0x402a21;
          memset(local_350,0,(ulong)(iVar6 - 1) << 3);
        }
        dVar33 = 1.0;
        auVar36._0_8_ = *(double *)((long)cvode_mem + 0x140);
        iVar5 = *(int *)((long)cvode_mem + 0x5f8);
        if (-1 < iVar6 && iVar5 != 0) {
          uVar18 = 0;
          do {
            local_370[uVar18] = local_370[uVar18 - 0x7d];
            uVar18 = uVar18 + 1;
          } while (iVar6 + 1 != uVar18);
        }
        if (iVar6 < 2) {
          dVar31 = -1.0;
          dVar40 = -1.0;
          dVar34 = dVar33;
          dVar48 = dVar33;
          dVar32 = auVar36._0_8_;
        }
        else {
          uVar18 = 2;
          dVar40 = 1.0;
          dVar31 = -1.0;
          dVar32 = auVar36._0_8_;
          if (iVar6 != 2) {
            uVar18 = uVar26 & 0xffffffff;
            uVar26 = 2;
            lVar9 = 0x45;
            dVar31 = -1.0;
            do {
              dVar32 = dVar32 + *(double *)((long)cvode_mem + uVar26 * 8 + 0x170);
              lVar24 = lVar9;
              do {
                *(double *)((long)cvode_mem + lVar24 * 8) =
                     *(double *)((long)cvode_mem + (ulong)((int)lVar24 - 0x44) * 8 + 0x218) *
                     (auVar36._0_8_ / dVar32) + *(double *)((long)cvode_mem + lVar24 * 8);
                lVar10 = lVar24 + -0x43;
                lVar24 = lVar24 + -1;
              } while (1 < lVar10);
              dVar31 = dVar31 + -1.0 / (double)(int)uVar26;
              uVar26 = uVar26 + 1;
              lVar9 = lVar9 + 1;
            } while (uVar26 != uVar18);
            dVar40 = *(double *)((long)cvode_mem + 0x220);
          }
          dVar32 = dVar32 + *(double *)((long)cvode_mem + (long)iVar6 * 8 + 0x170);
          dVar34 = auVar36._0_8_ / dVar32;
          if (iVar5 != 0) {
            iVar5 = (int)uVar18 + 1;
            prVar16 = local_370;
            do {
              prVar16[uVar18] = prVar16[(int)uVar18 - 1] * dVar34 + prVar16[uVar18 - 0x7d];
              iVar5 = iVar5 + -1;
              prVar16 = prVar16 + -1;
            } while (1 < iVar5);
          }
          dVar31 = dVar31 + -1.0 / (double)iVar6;
          dVar48 = -dVar40 - dVar31;
          dVar40 = -dVar40 - dVar34;
          do {
            uVar26 = uVar18 - 1;
            *(double *)((long)cvode_mem + uVar26 * 8 + 0x220) =
                 a[uVar26 & 0xffffffff] * dVar48 + *(double *)((long)cvode_mem + uVar26 * 8 + 0x220)
            ;
            bVar4 = 1 < (long)uVar18;
            uVar18 = uVar26;
          } while (bVar4);
        }
        dVar46 = (1.0 - dVar40) + dVar31;
        dVar45 = (double)iVar6 * dVar46 + 1.0;
        uVar26 = (ulong)DAT_0065c6d0;
        dVar47 = (double)((ulong)(dVar46 / (dVar31 * dVar45)) & uVar26);
        *(double *)((long)cvode_mem + 0x1f8) = dVar47;
        dVar46 = *(double *)((long)cvode_mem + (long)iVar6 * 8 + 0x218);
        *(ulong *)((long)cvode_mem + 0x210) =
             (ulong)((dVar48 * dVar45) / (dVar34 * dVar46)) & uVar26;
        if (*(int *)((long)cvode_mem + 300) == 1) {
          if (1 < iVar6) {
            dVar33 = 1.0 / (double)iVar6 + dVar31;
            auVar49._0_8_ = (1.0 - (dVar34 + dVar40)) + dVar33;
            auVar49._8_8_ = dVar48;
            auVar50._8_8_ = dVar46;
            auVar50._0_8_ = dVar33;
            auVar50 = divpd(auVar49,auVar50);
            dVar33 = ABS(auVar50._8_8_ * auVar50._0_8_);
          }
          *(double *)((long)cvode_mem + 0x1f0) = dVar33;
          auVar36._0_8_ =
               auVar36._0_8_ / (dVar32 + *(double *)((long)cvode_mem + (long)iVar6 * 8 + 0x178));
          dVar31 = dVar31 - 1.0 / (double)(iVar6 + 1);
          *(double *)((long)cvode_mem + 0x200) =
               ABS((((auVar36._0_8_ - dVar40) + 1.0 + dVar31) / dVar45) /
                   ((double)(iVar6 + 2) * auVar36._0_8_ * dVar31));
        }
        *(double *)((long)cvode_mem + 0x208) = *(double *)((long)cvode_mem + 0x2c0) / dVar47;
      }
      else if (*(int *)((long)cvode_mem + 0x20) == 1) {
        if (iVar6 == 1) {
          *(undefined8 *)((long)cvode_mem + 0x220) = 0x3ff0000000000000;
          *(undefined8 *)((long)cvode_mem + 0x210) = 0x3ff0000000000000;
          *(undefined8 *)((long)cvode_mem + 0x218) = 0x3ff0000000000000;
          *(undefined8 *)((long)cvode_mem + 0x1f0) = 0x3ff0000000000000;
          *(undefined8 *)((long)cvode_mem + 0x1f8) = 0x3fe0000000000000;
          *(undefined8 *)((long)cvode_mem + 0x200) = 0x3fb5555555555555;
          dVar33 = *(double *)((long)cvode_mem + 0x2c0) + *(double *)((long)cvode_mem + 0x2c0);
        }
        else {
          auVar36._0_8_ = *(double *)((long)cvode_mem + 0x140);
          local_328 = 1.0;
          if (iVar6 < 1) {
            *a = 1.0;
            dVar32 = 0.0;
            dVar34 = INFINITY;
            dVar33 = auVar36._0_8_;
          }
          else {
            uVar27 = uVar26 & 0xffffffff;
            uStack_3f0 = 0x402bf7;
            local_3a8 = auVar36._0_8_;
            memset((void *)((long)adStack_348 + 0x28),0,uVar27 * 8);
            uVar18 = 1;
            lVar9 = 2;
            auVar36._0_8_ = local_3a8;
            do {
              if ((uVar18 == iVar6 - 1) && (*(int *)((long)cvode_mem + 300) == 1)) {
                iVar5 = 1;
                dVar33 = 0.0;
                uVar19 = 0;
                do {
                  dVar33 = dVar33 + (adStack_348[uVar19 + 4] / (double)((int)uVar19 + 2)) *
                                    (double)iVar5;
                  iVar5 = -iVar5;
                  uVar19 = uVar19 + 1;
                } while (iVar6 - 1 != uVar19);
                *(double *)((long)cvode_mem + 0x1f0) =
                     (dVar33 * (double)iVar6) / adStack_348[uVar27 + 2];
              }
              lVar24 = lVar9;
              do {
                adStack_348[lVar24 + 3] =
                     adStack_348[lVar24 + 2] * (local_3a8 / auVar36._0_8_) + adStack_348[lVar24 + 3]
                ;
                lVar24 = lVar24 + -1;
              } while (1 < lVar24);
              auVar36._0_8_ = auVar36._0_8_ + *(double *)((long)cvode_mem + uVar18 * 8 + 0x178);
              uVar18 = uVar18 + 1;
              lVar9 = lVar9 + 1;
            } while (uVar18 != uVar27);
            iVar5 = 1;
            dVar34 = 0.0;
            uVar18 = 0;
            do {
              lVar9 = uVar18 + 4;
              uVar18 = uVar18 + 1;
              dVar34 = dVar34 + (adStack_348[lVar9] / (double)(int)uVar18) * (double)iVar5;
              iVar5 = -iVar5;
            } while (uVar27 != uVar18);
            iVar5 = 1;
            dVar32 = 0.0;
            uVar18 = 0;
            do {
              dVar32 = dVar32 + (adStack_348[uVar18 + 4] / (double)((int)uVar18 + 2)) *
                                (double)iVar5;
              iVar5 = -iVar5;
              uVar18 = uVar18 + 1;
            } while (uVar27 != uVar18);
            dVar34 = 1.0 / dVar34;
            *a = 1.0;
            uVar18 = 0;
            do {
              uVar19 = uVar18 + 1;
              *(double *)((long)cvode_mem + uVar18 * 8 + 0x220) =
                   (adStack_348[uVar18 + 4] / (double)(int)uVar19) * dVar34;
              uVar18 = uVar19;
              dVar33 = local_3a8;
            } while (uVar27 != uVar19);
          }
          auVar36._0_8_ = auVar36._0_8_ / dVar33;
          dVar33 = (dVar32 * dVar34) / auVar36._0_8_;
          *(double *)((long)cvode_mem + 0x1f8) = dVar33;
          *(double *)((long)cvode_mem + 0x210) =
               auVar36._0_8_ / *(double *)((long)cvode_mem + (long)iVar6 * 8 + 0x218);
          if (*(int *)((long)cvode_mem + 300) == 1) {
            if (0 < iVar6) {
              uVar26 = (uVar26 & 0xffffffff) + 1;
              do {
                adStack_348[uVar26 + 3] =
                     adStack_348[uVar26 + 2] * (1.0 / auVar36._0_8_) + adStack_348[uVar26 + 3];
                uVar26 = uVar26 - 1;
              } while (1 < uVar26);
            }
            if (iVar6 < 0) {
              auVar36._0_8_ = 0.0;
            }
            else {
              iVar5 = 1;
              auVar36._0_8_ = 0.0;
              uVar26 = 0;
              do {
                auVar36._0_8_ =
                     auVar36._0_8_ +
                     (adStack_348[uVar26 + 4] / (double)((int)uVar26 + 2)) * (double)iVar5;
                iVar5 = -iVar5;
                uVar26 = uVar26 + 1;
              } while (iVar6 + 1 != uVar26);
            }
            *(double *)((long)cvode_mem + 0x200) =
                 (dVar34 * auVar36._0_8_) / (double)*(int *)((long)cvode_mem + 0x130);
          }
          dVar33 = *(double *)((long)cvode_mem + 0x2c0) / dVar33;
        }
        *(double *)((long)cvode_mem + 0x208) = dVar33;
      }
      auVar36._0_8_ = 1.0;
      dVar33 = 1.0 / *(double *)((long)cvode_mem + 0x220);
      *(double *)((long)cvode_mem + 0x280) = dVar33;
      dVar33 = dVar33 * *(double *)((long)cvode_mem + 0x140);
      *(double *)((long)cvode_mem + 0x288) = dVar33;
      lVar9 = *(long *)((long)cvode_mem + 0x358);
      if (lVar9 == 0) {
        *(double *)((long)cvode_mem + 0x290) = dVar33;
      }
      else if (0 < lVar9) {
        auVar36._0_8_ = dVar33 / *(double *)((long)cvode_mem + 0x290);
      }
      *(double *)((long)cvode_mem + 0x298) = auVar36._0_8_;
      local_328 = 0.0;
      local_208[0] = 0;
      if (*(long *)((long)cvode_mem + 0x3f0) == 0) {
        *(undefined8 *)((long)cvode_mem + 0x2a0) = 0x3ff0000000000000;
        uVar7 = 0;
      }
      else {
        iVar6 = (uint)(local_3e4 != 9) * 2;
        if (local_3e4 == 6) {
          iVar6 = 0;
        }
        *(int *)((long)cvode_mem + 0x3e0) = iVar6;
        uVar7 = 1;
        if ((((local_3e4 != 7) && (local_3e4 != 9)) && (lVar9 != 0)) &&
           (lVar9 < *(long *)((long)cvode_mem + 0x410) + *(long *)((long)cvode_mem + 0x428))) {
          uVar7 = (uint)(*(double *)((long)cvode_mem + 0x418) <= ABS(auVar36._0_8_ + -1.0) &&
                        ABS(auVar36._0_8_ + -1.0) != *(double *)((long)cvode_mem + 0x418));
        }
      }
      uStack_3f0 = 0x4030fd;
      N_VConst(0.0,*(N_Vector *)((long)cvode_mem + 0xd8));
      NLS = *(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8);
      if (NLS->ops->setup == (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0) {
LAB_00403133:
        uStack_3f0 = 0x403158;
        iVar6 = SUNNonlinSolSolve(NLS,*(N_Vector *)((long)cvode_mem + 0x60),
                                  *(N_Vector *)((long)cvode_mem + 0xd8),
                                  *(N_Vector *)((long)cvode_mem + 200),
                                  *(realtype *)((long)cvode_mem + 0x208),uVar7,cvode_mem);
        uStack_3f0 = 0x40316f;
        SUNNonlinSolGetNumIters
                  (*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),(long *)(adStack_348 + 4));
        *(long *)((long)cvode_mem + 0x370) = *(long *)((long)cvode_mem + 0x370) + (long)local_328;
        uStack_3f0 = 0x403192;
        SUNNonlinSolGetNumConvFails(*(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8),local_208);
        *(long *)((long)cvode_mem + 0x378) = *(long *)((long)cvode_mem + 0x378) + local_208[0];
        if (iVar6 != 0) goto LAB_004034c6;
        uStack_3f0 = 0x4031cd;
        N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0x60),1.0,
                     *(N_Vector *)((long)cvode_mem + 0xd8),*(N_Vector *)((long)cvode_mem + 0xd0));
        if (*(int *)((long)cvode_mem + 0x2b8) == 0) {
          uStack_3f0 = 0x4031e9;
          rVar28 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0xd8),
                               *(N_Vector *)((long)cvode_mem + 200));
          *(realtype *)((long)cvode_mem + 0x2b0) = rVar28;
        }
        *(undefined4 *)((long)cvode_mem + 0x448) = 0;
        if (*(int *)((long)cvode_mem + 0x58) != 0) {
          p_Var22 = *(N_Vector *)((long)cvode_mem + 0xe8);
          z = *(N_Vector *)((long)cvode_mem + 0xe0);
          uStack_3f0 = 0x403229;
          iVar6 = N_VConstrMask(*(N_Vector *)((long)cvode_mem + 0x108),
                                *(N_Vector *)((long)cvode_mem + 0xd0),p_Var22);
          if (iVar6 == 0) {
            uStack_3f0 = 0x403248;
            N_VCompare(1.5,*(N_Vector *)((long)cvode_mem + 0x108),z);
            uStack_3f0 = 0x40325a;
            N_VProd(z,*(N_Vector *)((long)cvode_mem + 0x108),z);
            uStack_3f0 = 0x40326c;
            N_VDiv(z,*(N_Vector *)((long)cvode_mem + 200),z);
            uStack_3f0 = 0x40328e;
            N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0xd0),-0.1,z,z);
            uStack_3f0 = 0x40329c;
            N_VProd(z,p_Var22,z);
            uStack_3f0 = 0x4032ab;
            rVar28 = N_VWrmsNorm(z,*(N_Vector *)((long)cvode_mem + 200));
            if (*(double *)((long)cvode_mem + 0x208) < rVar28) {
              iVar6 = -0xf;
              if (*(double *)((long)cvode_mem + 0x2e8) * 1.000001 <
                  ABS(*(double *)((long)cvode_mem + 0x140))) {
                uStack_3f0 = 0x403663;
                N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0x60),-1.0,
                             *(N_Vector *)((long)cvode_mem + 0xd0),z);
                uStack_3f0 = 0x403671;
                N_VProd(p_Var22,z,z);
                uStack_3f0 = 0x40367d;
                rVar28 = N_VMinQuotient(*(N_Vector *)((long)cvode_mem + 0x60),z);
                auVar36._0_8_ = rVar28 * 0.9;
                if (auVar36._0_8_ <= 0.1) {
                  auVar36._0_8_ = 0.1;
                }
                dVar33 = *(double *)((long)cvode_mem + 0x2e8) /
                         ABS(*(double *)((long)cvode_mem + 0x140));
                if (auVar36._0_8_ <= dVar33) {
                  auVar36._0_8_ = dVar33;
                }
                *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_;
                iVar6 = 0xb;
              }
              goto LAB_004034c6;
            }
            uStack_3f0 = 0x4032df;
            N_VLinearSum(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),-1.0,z,
                         *(N_Vector *)((long)cvode_mem + 0xd8));
          }
        }
        local_3e4 = 0;
        *(undefined4 *)((long)cvode_mem + 0x5fc) = 0;
        if ((char)local_398 == '\0') goto code_r0x004032f2;
        goto LAB_0040331b;
      }
      uStack_3f0 = 0x40311e;
      iVar6 = SUNNonlinSolSetup(NLS,*(N_Vector *)((long)cvode_mem + 0xd8),cvode_mem);
      if (iVar6 < 0) {
        iVar6 = -0xe;
      }
      else {
        if (iVar6 == 0) {
          NLS = *(SUNNonlinearSolver *)((long)cvode_mem + 0x3c8);
          goto LAB_00403133;
        }
        iVar6 = 0x386;
      }
LAB_004034c6:
      *(long *)((long)cvode_mem + 0x368) = *(long *)((long)cvode_mem + 0x368) + 1;
      uStack_3f0 = 0x4034e0;
      local_3e4 = iVar6;
      cvRestore((CVodeMem)cvode_mem,(realtype)local_3b8._0_8_);
      if (iVar6 < 0) {
        iVar5 = -0x10;
        if (iVar6 + 8U < 3) {
          iVar5 = iVar6;
        }
        goto LAB_00404960;
      }
      *(undefined8 *)((long)cvode_mem + 0x2f8) = 0x3ff0000000000000;
      if ((*(double *)((long)cvode_mem + 0x2e8) * 1.000001 <
           ABS(*(double *)((long)cvode_mem + 0x140))) &&
         (local_3bc + 1 != *(int *)((long)cvode_mem + 0x2e0))) {
        if (iVar6 != 0xb) {
LAB_00403553:
          dVar33 = *(double *)((long)cvode_mem + 0x2e8) / ABS(*(double *)((long)cvode_mem + 0x140));
          auVar36._0_8_ = *(double *)((long)cvode_mem + 0x340);
          if (*(double *)((long)cvode_mem + 0x340) <= dVar33) {
            auVar36._0_8_ = dVar33;
          }
          *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_;
        }
        local_3e4 = 7;
        uStack_3f0 = 0x40357f;
        local_3bc = local_3bc + 1;
        cvRescale((CVodeMem)cvode_mem);
        goto LAB_004028e1;
      }
      if (iVar6 == 10) {
        iVar5 = -10;
      }
      else if (iVar6 == 0xb) {
        iVar5 = -0xf;
      }
      else {
        if (iVar6 != 0x386) goto LAB_00403553;
        iVar5 = -4;
      }
      goto LAB_00404960;
    }
    rVar28 = *(realtype *)((long)cvode_mem + 0x168);
    *tret = rVar28;
    *(realtype *)((long)cvode_mem + 0x170) = rVar28;
    if (*(int *)((long)cvode_mem + 0x24) == 0) {
      pcVar8 = "cvInitialSetup";
      pcVar23 = "No integration tolerances have been specified.";
    }
    else {
      if (*(int *)((long)cvode_mem + 0x44) == 0) {
        pvVar12 = cvode_mem;
        if ((*(int *)((long)cvode_mem + 0x40) != 0) &&
           (*(long *)(*(long *)(*(long *)((long)cvode_mem + 0xe0) + 8) + 0xb0) == 0)) {
          pcVar8 = "cvInitialSetup";
          pcVar23 = "Missing N_VMin routine from N_Vector";
          goto LAB_0040225f;
        }
      }
      else {
        pvVar12 = *(void **)((long)cvode_mem + 0x18);
      }
      *(void **)((long)cvode_mem + 0x50) = pvVar12;
      local_3e0 = tout;
      if (*(int *)((long)cvode_mem + 0x58) != 0) {
        uStack_3f0 = 0x4023ab;
        iVar6 = N_VConstrMask(*(N_Vector *)((long)cvode_mem + 0x108),
                              *(N_Vector *)((long)cvode_mem + 0x60),
                              *(N_Vector *)((long)cvode_mem + 0xe0));
        if (iVar6 == 0) {
          pcVar8 = "cvInitialSetup";
          pcVar23 = "y0 fails to satisfy constraints.";
          goto LAB_0040225f;
        }
        pvVar12 = *(void **)((long)cvode_mem + 0x50);
      }
      uStack_3f0 = 0x4023c5;
      iVar6 = (**(code **)((long)cvode_mem + 0x48))
                        (*(undefined8 *)((long)cvode_mem + 0x60),
                         *(undefined8 *)((long)cvode_mem + 200),pvVar12);
      if (iVar6 == 0) {
        if (*(code **)((long)cvode_mem + 1000) != (code *)0x0) {
          uStack_3f0 = 0x402463;
          iVar6 = (**(code **)((long)cvode_mem + 1000))(cvode_mem);
          if (iVar6 != 0) {
            pcVar8 = "cvInitialSetup";
            pcVar23 = "The linear solver\'s init routine failed.";
            iVar6 = -5;
            iVar5 = -5;
            goto LAB_0040226c;
          }
        }
        uStack_3f0 = 0x404875;
        iVar6 = cvNlsInit((CVodeMem)cvode_mem);
        if (iVar6 != 0) {
          pcVar8 = "cvInitialSetup";
          pcVar23 = "The nonlinear solver\'s init routine failed.";
          iVar6 = -0xd;
          iVar5 = -0xd;
          goto LAB_0040226c;
        }
        proj_mem = *(CVodeProjMem *)((long)cvode_mem + 0x5f0);
        if (*(int *)((long)cvode_mem + 0x5f8) == 0) {
          if (proj_mem != (CVodeProjMem)0x0) goto LAB_00404b1d;
        }
        else {
          if (proj_mem == (CVodeProjMem)0x0) {
            pcVar8 = "cvInitialSetup";
            pcVar23 = "proj_mem = NULL illegal.";
            iVar6 = -0x1d;
            iVar5 = -0x1d;
            goto LAB_0040226c;
          }
LAB_00404b1d:
          uStack_3f0 = 0x404b22;
          iVar6 = cvProjInit(proj_mem);
          if (iVar6 != 0) {
            pcVar8 = "cvInitialSetup";
            pcVar23 = "A memory request failed.";
            iVar6 = -0x14;
            iVar5 = -0x14;
            goto LAB_0040226c;
          }
          *(undefined4 *)((long)cvode_mem + 0x5fc) = 0;
        }
        uStack_3f0 = 0x404b6e;
        iVar6 = (**(code **)((long)cvode_mem + 0x10))
                          (*(undefined8 *)((long)cvode_mem + 0x168),
                           *(undefined8 *)((long)cvode_mem + 0x60),
                           *(undefined8 *)((long)cvode_mem + 0x68),
                           *(undefined8 *)((long)cvode_mem + 0x18));
        *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
        if (iVar6 < 0) {
          pcVar8 = "CVode";
          pcVar23 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
          iVar6 = -8;
          iVar5 = -8;
          goto LAB_004025b8;
        }
        if (iVar6 != 0) {
          pcVar8 = "CVode";
          pcVar23 = "The right-hand side routine failed at the first call.";
          iVar6 = -9;
          iVar5 = -9;
          goto LAB_0040226c;
        }
        if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
           ((local_3e0 - *(double *)((long)cvode_mem + 0x168)) *
            (*(double *)((long)cvode_mem + 0x118) - *(double *)((long)cvode_mem + 0x168)) <= 0.0))
        goto LAB_004048c9;
        auVar36._0_8_ = *(double *)((long)cvode_mem + 0x138);
        *(double *)((long)cvode_mem + 0x140) = auVar36._0_8_;
        if (((auVar36._0_8_ != 0.0) || (NAN(auVar36._0_8_))) &&
           ((local_3e0 - *(double *)((long)cvode_mem + 0x168)) * auVar36._0_8_ < 0.0)) {
          pcVar8 = "CVode";
          pcVar23 = "h0 and tout - t0 inconsistent.";
          goto LAB_0040225f;
        }
        if ((auVar36._0_8_ == 0.0) && (!NAN(auVar36._0_8_))) {
          rVar28 = local_3e0;
          if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
             (0.0 < (local_3e0 - *(double *)((long)cvode_mem + 0x118)) *
                    (local_3e0 - *(double *)((long)cvode_mem + 0x168)))) {
            rVar28 = *(double *)((long)cvode_mem + 0x118);
          }
          uStack_3f0 = 0x404ccb;
          iVar6 = cvHin((CVodeMem)cvode_mem,rVar28);
          if (iVar6 != 0) {
            iVar6 = cvHandleFailure((CVodeMem)cvode_mem,iVar6);
            return iVar6;
          }
          auVar36._0_8_ = *(double *)((long)cvode_mem + 0x140);
        }
        dVar33 = ABS(auVar36._0_8_);
        dVar32 = dVar33 * *(double *)((long)cvode_mem + 0x2f0);
        if (1.0 < dVar32) {
          auVar36._0_8_ = auVar36._0_8_ / dVar32;
          *(double *)((long)cvode_mem + 0x140) = auVar36._0_8_;
          dVar33 = ABS(auVar36._0_8_);
        }
        if (dVar33 < *(double *)((long)cvode_mem + 0x2e8)) {
          auVar36._0_8_ = auVar36._0_8_ * (*(double *)((long)cvode_mem + 0x2e8) / dVar33);
          *(double *)((long)cvode_mem + 0x140) = auVar36._0_8_;
        }
        if (*(int *)((long)cvode_mem + 0x110) != 0) {
          if (0.0 < ((*(double *)((long)cvode_mem + 0x168) + auVar36._0_8_) -
                    *(double *)((long)cvode_mem + 0x118)) * auVar36._0_8_) {
            auVar36._0_8_ =
                 (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) *
                 (*(double *)((long)cvode_mem + 0x118) - *(double *)((long)cvode_mem + 0x168));
            *(double *)((long)cvode_mem + 0x140) = auVar36._0_8_;
          }
        }
        *(double *)((long)cvode_mem + 0x160) = auVar36._0_8_;
        *(double *)((long)cvode_mem + 0x430) = auVar36._0_8_;
        *(double *)((long)cvode_mem + 0x148) = auVar36._0_8_;
        uStack_3f0 = 0x404e9c;
        N_VScale(auVar36._0_8_,*(N_Vector *)((long)cvode_mem + 0x68),
                 *(N_Vector *)((long)cvode_mem + 0x68));
        if (*(int *)((long)cvode_mem + 0x578) < 1) {
LAB_00404ecd:
          lVar9 = *(long *)((long)cvode_mem + 0x358);
          tout = local_3e0;
          goto LAB_004022ac;
        }
        uStack_3f0 = 0x404ead;
        iVar6 = cvRcheck1((CVodeMem)cvode_mem);
        if (iVar6 != -0xc) goto LAB_00404ecd;
        pcVar8 = "cvRcheck1";
        goto LAB_004024a8;
      }
      if (*(int *)((long)cvode_mem + 0x24) == 3) {
        pcVar8 = "cvInitialSetup";
        pcVar23 = "The user-provide EwtSet function failed.";
      }
      else {
        pcVar8 = "cvInitialSetup";
        pcVar23 = "Initial ewt has component(s) equal to zero (illegal).";
      }
    }
  }
LAB_0040225f:
  iVar6 = -0x16;
  iVar5 = -0x16;
LAB_0040226c:
  uStack_3f0 = 0x402273;
  cvProcessError((CVodeMem)cvode_mem,iVar5,"CVODE",pcVar8,pcVar23);
  return iVar6;
code_r0x004032f2:
  uStack_3f0 = 0x40330a;
  iVar5 = cvDoProjection((CVodeMem)cvode_mem,&local_3e4,(realtype)local_3b8._0_8_,&local_384);
  if (iVar5 == 3) goto LAB_004028e1;
  if (iVar5 != 0) {
LAB_00404960:
    uStack_3f0 = 0x40496a;
    iVar6 = cvHandleFailure((CVodeMem)cvode_mem,iVar5);
    rVar28 = *(realtype *)((long)cvode_mem + 0x168);
    *local_3d0 = rVar28;
    *(realtype *)((long)cvode_mem + 0x170) = rVar28;
    p_Var22 = *(N_Vector *)((long)cvode_mem + 0x60);
    yout = local_3d8;
    goto LAB_00404996;
  }
LAB_0040331b:
  local_3a8 = *(double *)((long)cvode_mem + 0x2b0) * *(double *)((long)cvode_mem + 0x1f8);
  if (local_3a8 <= 1.0) goto LAB_004036c0;
  *(long *)((long)cvode_mem + 0x380) = *(long *)((long)cvode_mem + 0x380) + 1;
  local_3e4 = 9;
  uStack_3f0 = 0x403360;
  cvRestore((CVodeMem)cvode_mem,(realtype)local_3b8._0_8_);
  auVar36._0_8_ = ABS(*(double *)((long)cvode_mem + 0x140));
  iVar5 = -3;
  if (auVar36._0_8_ <= *(double *)((long)cvode_mem + 0x2e8) * 1.000001) goto LAB_00404960;
  uVar7 = (int)local_3c8 + 1;
  if (uVar7 == *(uint *)((long)cvode_mem + 0x2dc)) goto LAB_00404960;
  *(undefined8 *)((long)cvode_mem + 0x2f8) = 0x3ff0000000000000;
  if ((int)local_3c8 < 3) {
    uStack_3f0 = 0x4033f3;
    rVar28 = SUNRpowerR(local_3a8 * 6.0,1.0 / (double)*(int *)((long)cvode_mem + 0x130));
    auVar29._0_8_ = rVar28 + 1e-06;
    auVar29._8_8_ = *(ulong *)((long)cvode_mem + 0x140) & 0x7fffffffffffffff;
    auVar35._8_8_ = *(undefined8 *)((long)cvode_mem + 0x2e8);
    auVar35._0_8_ = 0x3ff0000000000000;
    auVar36 = divpd(auVar35,auVar29);
    auVar36._0_8_ = auVar36._0_8_;
    if (auVar36._0_8_ <= auVar36._8_8_) {
      auVar36._0_8_ = auVar36._8_8_;
    }
    dVar33 = *(double *)((long)cvode_mem + 0x330);
    if (*(double *)((long)cvode_mem + 0x330) <= auVar36._0_8_) {
      dVar33 = auVar36._0_8_;
    }
    *(double *)((long)cvode_mem + 0x158) = dVar33;
    if (*(int *)((long)cvode_mem + 0x350) <= (int)uVar7) {
      if (*(double *)((long)cvode_mem + 0x338) <= dVar33) {
        dVar33 = *(double *)((long)cvode_mem + 0x338);
      }
      *(double *)((long)cvode_mem + 0x158) = dVar33;
    }
  }
  else {
    auVar36._0_8_ = *(double *)((long)cvode_mem + 0x2e8) / auVar36._0_8_;
    dVar33 = *(double *)((long)cvode_mem + 0x330);
    if (*(double *)((long)cvode_mem + 0x330) <= auVar36._0_8_) {
      dVar33 = auVar36._0_8_;
    }
    *(double *)((long)cvode_mem + 0x158) = dVar33;
    if (*(int *)((long)cvode_mem + 0x120) < 2) {
      dVar33 = *(double *)((long)cvode_mem + 0x140) * dVar33;
      *(double *)((long)cvode_mem + 0x140) = dVar33;
      *(double *)((long)cvode_mem + 0x150) = dVar33;
      *(double *)((long)cvode_mem + 0x160) = dVar33;
      *(undefined4 *)((long)cvode_mem + 300) = 10;
      *(undefined4 *)((long)cvode_mem + 0x560) = 0;
      uStack_3f0 = 0x4035d6;
      iVar6 = (**(code **)((long)cvode_mem + 0x10))
                        (*(undefined8 *)((long)cvode_mem + 0x168),
                         *(undefined8 *)((long)cvode_mem + 0x60),
                         *(undefined8 *)((long)cvode_mem + 0xe0),
                         *(undefined8 *)((long)cvode_mem + 0x18));
      *(long *)((long)cvode_mem + 0x360) = *(long *)((long)cvode_mem + 0x360) + 1;
      if (iVar6 < 0) {
        iVar5 = -8;
        goto LAB_00404960;
      }
      if (iVar6 != 0) {
        iVar5 = -0xb;
        goto LAB_00404960;
      }
      uStack_3f0 = 0x403603;
      N_VScale(*(realtype *)((long)cvode_mem + 0x140),*(N_Vector *)((long)cvode_mem + 0xe0),
               *(N_Vector *)((long)cvode_mem + 0x68));
      goto LAB_00403603;
    }
    uStack_3f0 = 0x403490;
    cvAdjustOrder((CVodeMem)cvode_mem,-1);
    iVar6 = *(int *)((long)cvode_mem + 0x120);
    *(int *)((long)cvode_mem + 0x130) = iVar6;
    *(int *)((long)cvode_mem + 0x120) = iVar6 + -1;
    *(int *)((long)cvode_mem + 300) = iVar6;
  }
  uStack_3f0 = 0x4034b3;
  cvRescale((CVodeMem)cvode_mem);
LAB_00403603:
  local_3c8 = (ulong)uVar7;
  goto LAB_004028e1;
LAB_004036c0:
  lVar9 = *(long *)((long)cvode_mem + 0x358);
  *(long *)((long)cvode_mem + 0x358) = lVar9 + 1;
  *(int *)((long)cvode_mem + 0x560) = *(int *)((long)cvode_mem + 0x560) + 1;
  uVar2 = *(undefined8 *)((long)cvode_mem + 0x140);
  *(undefined8 *)((long)cvode_mem + 0x438) = uVar2;
  iVar6 = *(int *)((long)cvode_mem + 0x120);
  uVar26 = (ulong)iVar6;
  *(int *)((long)cvode_mem + 0x420) = iVar6;
  if (1 < (long)uVar26) {
    do {
      *(undefined8 *)((long)cvode_mem + uVar26 * 8 + 0x178) =
           *(undefined8 *)((long)cvode_mem + uVar26 * 8 + 0x170);
      bVar4 = 2 < uVar26;
      uVar26 = uVar26 - 1;
    } while (bVar4);
  }
  if (0 < lVar9 && iVar6 == 1) {
    *(undefined8 *)((long)cvode_mem + 0x188) = *(undefined8 *)((long)cvode_mem + 0x180);
  }
  *(undefined8 *)((long)cvode_mem + 0x180) = uVar2;
  uStack_3f0 = 0x40375e;
  N_VScaleAddMulti(iVar6 + 1,a,*(N_Vector *)((long)cvode_mem + 0xd8),Y,Y);
  p_Var22 = local_3d8;
  if (*(int *)((long)cvode_mem + 0x5fc) != 0) {
    uStack_3f0 = 0x40378b;
    N_VScaleAddMulti(*(int *)((long)cvode_mem + 0x120) + 1,local_370,
                     *(N_Vector *)((long)cvode_mem + 0xe0),Y,Y);
  }
  iVar6 = *(int *)((long)cvode_mem + 300) + -1;
  *(int *)((long)cvode_mem + 300) = iVar6;
  if ((iVar6 == 1) && (*(int *)((long)cvode_mem + 0x120) != *(int *)((long)cvode_mem + 0x2c8))) {
    uStack_3f0 = 0x4037c6;
    N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),
             *(N_Vector *)((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
    *(undefined8 *)((long)cvode_mem + 0x440) = *(undefined8 *)((long)cvode_mem + 0x210);
    *(undefined4 *)((long)cvode_mem + 0x45c) = *(undefined4 *)((long)cvode_mem + 0x2c8);
  }
  if ((*(double *)((long)cvode_mem + 0x2f8) != 1.0) || (NAN(*(double *)((long)cvode_mem + 0x2f8))))
  {
    uStack_3f0 = 0x403862;
    rVar28 = SUNRpowerR(local_3a8 * 6.0,1.0 / (double)*(int *)((long)cvode_mem + 0x130));
    auVar36._0_8_ = 1.0 / (rVar28 + 1e-06);
    *(double *)((long)cvode_mem + 0x3a0) = auVar36._0_8_;
    if (*(int *)((long)cvode_mem + 300) == 0) {
      *(undefined4 *)((long)cvode_mem + 300) = 2;
      *(undefined8 *)((long)cvode_mem + 0x398) = 0;
      iVar6 = *(int *)((long)cvode_mem + 0x120);
      auVar36._0_8_ = 0.0;
      if (1 < (long)iVar6) {
        uStack_3f0 = 0x4038cf;
        rVar28 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + (long)iVar6 * 8 + 0x60),
                             *(N_Vector *)((long)cvode_mem + 200));
        uStack_3f0 = 0x4038fb;
        rVar28 = SUNRpowerR(rVar28 * *(double *)((long)cvode_mem + 0x1f0) * 6.0,
                            1.0 / (double)*(int *)((long)cvode_mem + 0x120));
        auVar36._0_8_ = 1.0 / (rVar28 + 1e-06);
        iVar6 = *(int *)((long)cvode_mem + 0x120);
      }
      dVar33 = 0.0;
      *(double *)((long)cvode_mem + 0x398) = auVar36._0_8_;
      *(undefined8 *)((long)cvode_mem + 0x3a8) = 0;
      if (iVar6 != *(int *)((long)cvode_mem + 0x2c8)) {
        dVar32 = *(double *)((long)cvode_mem + 0x440);
        local_3b8._0_8_ = dVar32;
        if ((dVar32 != 0.0) || (NAN(dVar32))) {
          local_398 = *(double *)((long)cvode_mem + 0x210);
          uStack_390 = 0;
          uStack_3f0 = 0x40397a;
          rVar28 = SUNRpowerI(*(double *)((long)cvode_mem + 0x140) /
                              *(double *)((long)cvode_mem + 0x188),*(int *)((long)cvode_mem + 0x130)
                             );
          uStack_3f0 = 0x4039b9;
          N_VLinearSum(rVar28 * (-local_398 / (double)local_3b8._0_8_),
                       *(N_Vector *)
                        ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60),1.0,
                       *(N_Vector *)((long)cvode_mem + 0xd8),*(N_Vector *)((long)cvode_mem + 0xe0));
          uStack_3f0 = 0x4039cc;
          rVar28 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + 0xe0),
                               *(N_Vector *)((long)cvode_mem + 200));
          uStack_3f0 = 0x4039fc;
          rVar28 = SUNRpowerR(rVar28 * *(double *)((long)cvode_mem + 0x200) * 10.0,
                              1.0 / (double)(*(int *)((long)cvode_mem + 0x130) + 1));
          dVar33 = 1.0 / (rVar28 + 1e-06);
          auVar36._0_8_ = *(double *)((long)cvode_mem + 0x398);
        }
      }
      yout = local_3d8;
      *(double *)((long)cvode_mem + 0x3a8) = dVar33;
      dVar32 = *(double *)((long)cvode_mem + 0x3a0);
      dVar34 = dVar32;
      if (dVar32 <= dVar33) {
        dVar34 = dVar33;
      }
      dVar48 = auVar36._0_8_;
      if (auVar36._0_8_ <= dVar34) {
        dVar48 = dVar34;
      }
      if ((*(double *)((long)cvode_mem + 0x300) <= dVar48 &&
           dVar48 != *(double *)((long)cvode_mem + 0x300)) &&
         (dVar48 < *(double *)((long)cvode_mem + 0x308))) {
        *(undefined8 *)((long)cvode_mem + 0x158) = 0x3ff0000000000000;
        goto LAB_00403a7b;
      }
      if ((dVar48 == dVar32) && (!NAN(dVar48) && !NAN(dVar32))) {
        *(double *)((long)cvode_mem + 0x158) = dVar32;
        goto LAB_00403a7b;
      }
      if ((dVar48 != auVar36._0_8_) || (NAN(dVar48) || NAN(auVar36._0_8_))) {
        *(double *)((long)cvode_mem + 0x158) = dVar33;
        *(int *)((long)cvode_mem + 0x124) = *(int *)((long)cvode_mem + 0x120) + 1;
        if (*(int *)((long)cvode_mem + 0x20) == 2) {
          uStack_3f0 = 0x404391;
          N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0xd8),
                   *(N_Vector *)
                    ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x2c8) * 8 + 0x60));
        }
      }
      else {
        *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_;
        *(int *)((long)cvode_mem + 0x124) = *(int *)((long)cvode_mem + 0x120) + -1;
      }
    }
    else {
      *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_;
LAB_00403a7b:
      *(undefined4 *)((long)cvode_mem + 0x124) = *(undefined4 *)((long)cvode_mem + 0x120);
      yout = p_Var22;
    }
    uStack_3f0 = 0x403a8f;
    cvSetEta((CVodeMem)cvode_mem);
  }
  else {
    iVar6 = *(int *)((long)cvode_mem + 300);
    if (iVar6 < 3) {
      iVar6 = 2;
    }
    *(int *)((long)cvode_mem + 300) = iVar6;
    *(undefined4 *)((long)cvode_mem + 0x124) = *(undefined4 *)((long)cvode_mem + 0x120);
    *(undefined8 *)((long)cvode_mem + 0x148) = *(undefined8 *)((long)cvode_mem + 0x140);
    *(undefined8 *)((long)cvode_mem + 0x158) = 0x3ff0000000000000;
    yout = p_Var22;
  }
  auVar36 = _DAT_006745c0;
  if (*(int *)((long)cvode_mem + 0x498) != 0) {
    iVar6 = *(int *)((long)cvode_mem + 0x120);
    if (2 < (long)iVar6) {
      lVar9 = 1;
      puVar13 = local_358;
      do {
        uVar26 = 6;
        puVar20 = puVar13;
        do {
          *puVar20 = puVar20[-4];
          puVar20 = puVar20 + -4;
          uVar26 = uVar26 - 1;
        } while (2 < uVar26);
        lVar9 = lVar9 + 1;
        puVar13 = puVar13 + 1;
      } while (lVar9 != 4);
      iVar5 = iVar6 + -2;
      auVar30._4_4_ = iVar5;
      auVar30._0_4_ = iVar5;
      auVar30._8_4_ = iVar5;
      auVar30._12_4_ = iVar5;
      iVar39 = 1;
      iVar43 = 2;
      uVar7 = 3;
      iVar44 = 4;
      auVar37 = _DAT_00666be0;
      iVar5 = 4;
      do {
        auVar50 = auVar37;
        auVar37._0_4_ = auVar50._0_4_ * iVar39;
        auVar38._8_4_ = (undefined4)((auVar50._8_8_ & 0xffffffff) * (ulong)uVar7);
        auVar38._4_4_ = auVar38._8_4_;
        auVar38._0_4_ = auVar37._0_4_;
        auVar38._12_4_ = auVar50._12_4_ * iVar44;
        auVar37._8_8_ = auVar38._8_8_;
        auVar37._4_4_ = auVar50._4_4_ * iVar43;
        iVar39 = iVar39 + auVar36._0_4_;
        iVar43 = iVar43 + auVar36._4_4_;
        uVar7 = uVar7 + auVar36._8_4_;
        iVar44 = iVar44 + auVar36._12_4_;
        iVar11 = iVar5 + -4;
        iVar15 = iVar5 + (iVar6 + 2U & 0xfffffffc);
        iVar5 = iVar11;
      } while (iVar15 != 8);
      iVar11 = -iVar11;
      auVar41._4_4_ = iVar11;
      auVar41._0_4_ = iVar11;
      auVar41._8_4_ = iVar11;
      auVar41._12_4_ = iVar11;
      auVar30 = auVar30 ^ _DAT_0065b9b0;
      auVar36 = (auVar41 | _DAT_006745d0) ^ _DAT_0065b9b0;
      auVar42._0_4_ = -(uint)(auVar30._0_4_ < auVar36._0_4_);
      auVar42._4_4_ = -(uint)(auVar30._4_4_ < auVar36._4_4_);
      auVar42._8_4_ = -(uint)(auVar30._8_4_ < auVar36._8_4_);
      auVar42._12_4_ = -(uint)(auVar30._12_4_ < auVar36._12_4_);
      auVar36 = ~auVar42 & auVar37 | auVar50 & auVar42;
      iVar39 = auVar36._8_4_ * auVar36._0_4_ * auVar36._4_4_ * auVar36._12_4_;
      iVar5 = iVar39 * iVar6;
      auVar36._0_8_ = *(double *)((long)cvode_mem + 0x210);
      if (auVar36._0_8_ <= 1e-10) {
        auVar36._0_8_ = 1e-10;
      }
      local_3b8._0_8_ =
           ((double)((iVar6 + 1) * iVar5) * *(double *)((long)cvode_mem + 0x2b0)) / auVar36._0_8_;
      local_3a8 = (double)iVar5;
      dStack_3a0 = 0.0;
      uStack_3f0 = 0x403bf9;
      local_398 = N_VWrmsNorm(*(N_Vector *)((long)cvode_mem + (long)iVar6 * 8 + 0x60),
                              *(N_Vector *)((long)cvode_mem + 200));
      dStack_3a0 = local_3a8;
      uStack_3f0 = 0x403c2b;
      local_3a8 = (double)iVar39;
      uStack_390 = extraout_XMM0_Qb;
      rVar28 = N_VWrmsNorm(*(N_Vector *)
                            ((long)cvode_mem + (long)*(int *)((long)cvode_mem + 0x120) * 8 + 0x58),
                           *(N_Vector *)((long)cvode_mem + 200));
      *(double *)((long)cvode_mem + 0x4c8) = rVar28 * local_3a8 * rVar28 * local_3a8;
      *(double *)((long)cvode_mem + 0x4d0) = local_398 * dStack_3a0 * local_398 * dStack_3a0;
      *(double *)((long)cvode_mem + 0x4d8) = (double)local_3b8._0_8_ * (double)local_3b8._0_8_;
      iVar6 = *(int *)((long)cvode_mem + 0x120);
      yout = local_3d8;
    }
    auVar50 = _DAT_0065c6d0;
    if (*(int *)((long)cvode_mem + 0x124) < iVar6) {
      *(undefined4 *)((long)cvode_mem + 0x560) = 0;
    }
    else if ((2 < iVar6) && (iVar6 + 5 <= *(int *)((long)cvode_mem + 0x560))) {
      lVar10 = 1;
      pdVar14 = adStack_348 + 4;
      plVar17 = local_208;
      lVar9 = local_368;
      lVar24 = local_360;
      do {
        auVar36._0_8_ = *(double *)((long)cvode_mem + lVar10 * 8 + 0x4c0);
        dVar33 = 0.0;
        lVar25 = 0;
        dVar32 = auVar36._0_8_;
        do {
          dVar34 = *(double *)(lVar24 + lVar25);
          if (dVar34 <= dVar32) {
            dVar32 = dVar34;
          }
          if (dVar33 <= dVar34) {
            dVar33 = dVar34;
          }
          lVar25 = lVar25 + 0x20;
        } while (lVar25 != 0xa0);
        yout = local_3d8;
        if (dVar32 < dVar33 * 1e-10) goto LAB_0040457a;
        adStack_f8[lVar10 + 4] = dVar33;
        adStack_348[lVar10] = dVar33 * dVar33;
        dVar32 = 0.0;
        lVar25 = 0;
        dVar34 = 0.0;
        dVar33 = auVar36._0_8_;
        do {
          pdVar1 = (double *)(lVar9 + lVar25);
          dVar33 = dVar33 / *pdVar1;
          dVar32 = dVar32 + dVar33;
          dVar34 = dVar34 + dVar33 * dVar33;
          lVar25 = lVar25 + 0x20;
          dVar33 = *pdVar1;
        } while (lVar25 != 0x80);
        dVar32 = dVar32 * 0.25;
        adStack_2a8[lVar10 + 8] = dVar32;
        adStack_1c0[lVar10 + 0xf] = ABS(dVar34 * 0.25 - dVar32 * dVar32);
        dVar33 = *(double *)((long)cvode_mem + lVar10 * 8 + 0x4e0);
        dVar32 = *(double *)((long)cvode_mem + lVar10 * 8 + 0x500);
        adStack_2a8[lVar10 + 4] = auVar36._0_8_ * dVar32 - dVar33 * dVar33;
        dVar34 = *(double *)((long)cvode_mem + lVar10 * 8 + 0x520);
        adStack_2a8[lVar10] = dVar33 * dVar32 - auVar36._0_8_ * dVar34;
        *(undefined8 *)((long)adStack_348 + (lVar10 + 0xb) * 8 + 0x28U) = 0;
        auVar36._0_8_ = *(double *)((long)cvode_mem + lVar10 * 8 + 0x540);
        *(double *)((long)adStack_348 + (lVar10 + 7) * 8 + 0x28U) =
             dVar33 * auVar36._0_8_ - dVar34 * dVar32;
        *(double *)((long)adStack_348 + (lVar10 + 3) * 8 + 0x28U) =
             dVar34 * dVar34 - auVar36._0_8_ * dVar32;
        lVar25 = 0x28;
        do {
          *(undefined8 *)((long)plVar17 + lVar25) = *(undefined8 *)((long)pdVar14 + lVar25);
          lVar25 = lVar25 + 0x20;
        } while (lVar25 != 200);
        lVar10 = lVar10 + 1;
        lVar24 = lVar24 + 8;
        lVar9 = lVar9 + 8;
        plVar17 = plVar17 + 1;
        pdVar14 = pdVar14 + 1;
      } while (lVar10 != 4);
      auVar36._0_8_ = adStack_1c0[0x11];
      if (adStack_1c0[0x12] <= adStack_1c0[0x11]) {
        auVar36._0_8_ = adStack_1c0[0x12];
      }
      dVar33 = adStack_1c0[0x10];
      if (auVar36._0_8_ <= adStack_1c0[0x10]) {
        dVar33 = auVar36._0_8_;
      }
      if (1e-08 <= dVar33) {
        if (ABS(local_1e0) < adStack_348[1] * 1e-10) goto LAB_0040457a;
        lVar9 = 0;
        do {
          *(double *)((long)adStack_1c0 + lVar9 + 8) =
               *(double *)((long)adStack_1c0 + lVar9) * (-local_1d8 / local_1e0) +
               *(double *)((long)adStack_1c0 + lVar9 + 8);
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0x80);
        local_1d8 = 0.0;
        lVar9 = 0;
        do {
          *(double *)((long)adStack_1c0 + lVar9 + 0x10) =
               *(double *)((long)adStack_1c0 + lVar9) * (-local_1d0 / local_1e0) +
               *(double *)((long)adStack_1c0 + lVar9 + 0x10);
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0x80);
        local_1d0 = 0.0;
        if (ABS(adStack_1c0[1]) < adStack_348[2] * 1e-10) goto LAB_0040457a;
        lVar9 = 0;
        do {
          *(double *)((long)adStack_1c0 + lVar9 + 0x30) =
               *(double *)((long)adStack_1c0 + lVar9 + 0x28) * (-adStack_1c0[2] / adStack_1c0[1]) +
               *(double *)((long)adStack_1c0 + lVar9 + 0x30);
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0x60);
        if (((ABS(adStack_1c0[10]) < adStack_348[3] * 1e-10) ||
            (auVar36._0_8_ = -adStack_1c0[0xe] / adStack_1c0[10], auVar36._0_8_ < 1e-10)) ||
           (100.0 < auVar36._0_8_)) goto LAB_0040457a;
        lVar9 = 0;
        do {
          adStack_228[lVar9 + 1] =
               ((*(double *)((long)adStack_348 + (lVar9 + 4) * 8 + 0x28U) * auVar36._0_8_ +
                *(double *)((long)adStack_348 + (lVar9 + 8) * 8 + 0x28U)) *
                auVar36._0_8_ * auVar36._0_8_ + adStack_2a8[lVar9 + 1]) * auVar36._0_8_ +
               adStack_2a8[lVar9 + 5];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        lVar9 = 1;
        dVar33 = 0.0;
        do {
          dVar32 = ABS(adStack_228[lVar9]) / adStack_348[lVar9];
          if (ABS(adStack_228[lVar9]) / adStack_348[lVar9] <= dVar33) {
            dVar32 = dVar33;
          }
          lVar9 = lVar9 + 1;
          dVar33 = dVar32;
        } while (lVar9 != 4);
        iVar5 = 2;
        if (0.001 <= dVar32) {
          uVar26 = 0;
          iVar5 = 1;
          do {
            lVar9 = 0;
            do {
              dVar33 = (*(double *)((long)adStack_348 + (lVar9 + 8) * 8 + 0x28U) * 3.0 +
                       *(double *)((long)adStack_348 + (lVar9 + 4) * 8 + 0x28U) *
                       auVar36._0_8_ * 4.0) * auVar36._0_8_ * auVar36._0_8_ + adStack_2a8[lVar9 + 1]
              ;
              dVar32 = 0.0;
              if (adStack_348[lVar9 + 1] * 1e-10 < ABS(dVar33)) {
                dVar32 = -adStack_228[lVar9 + 1] / dVar33;
              }
              adStack_f8[lVar9 + 1] = dVar32 + auVar36._0_8_;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 1;
            puVar21 = local_90;
            do {
              auVar36._0_8_ = adStack_f8[lVar9];
              lVar24 = 0;
              dVar33 = 0.0;
              do {
                dVar32 = ((*(double *)((long)local_300 + lVar24) * auVar36._0_8_ +
                          *(double *)((long)local_2e0 + lVar24)) * auVar36._0_8_ * auVar36._0_8_ +
                         *(double *)((long)adStack_2a8 + lVar24 + 8)) * auVar36._0_8_ +
                         *(double *)((long)adStack_2a8 + lVar24 + 0x28);
                *(double *)(puVar21 + lVar24 * 4) = dVar32;
                dVar32 = ABS(dVar32) / *(double *)((long)adStack_348 + lVar24 + 8);
                if (dVar32 <= dVar33) {
                  dVar32 = dVar33;
                }
                lVar24 = lVar24 + 8;
                dVar33 = dVar32;
              } while (lVar24 != 0x18);
              adStack_118[lVar9] = dVar32;
              lVar9 = lVar9 + 1;
              puVar21 = puVar21 + 8;
            } while (lVar9 != 4);
            dVar33 = adStack_118[1] + 1.0;
            uVar18 = 1;
            do {
              if (adStack_118[uVar18] < dVar33) {
                uVar26 = uVar18 & 0xffffffff;
                dVar33 = adStack_118[uVar18];
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != 4);
            auVar36._0_8_ = adStack_f8[(int)uVar26];
            if (dVar33 < 0.001) {
              iVar5 = 3;
              goto LAB_0040455e;
            }
            lVar9 = 8;
            do {
              *(undefined8 *)((long)adStack_228 + lVar9) =
                   *(undefined8 *)((long)auStack_b8 + lVar9 * 4 + (long)(int)uVar26 * 8);
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x20);
            iVar5 = iVar5 + 1;
          } while (iVar5 != 4);
          iVar5 = 0;
LAB_0040455e:
          if (0.001 < dVar33) goto LAB_0040457a;
        }
      }
      else {
        auVar36._0_8_ = adStack_1c0[0x11];
        if (adStack_1c0[0x11] <= adStack_1c0[0x12]) {
          auVar36._0_8_ = adStack_1c0[0x12];
        }
        dVar33 = adStack_1c0[0x10];
        if (adStack_1c0[0x10] <= auVar36._0_8_) {
          dVar33 = auVar36._0_8_;
        }
        if (2.5e-07 < dVar33) goto LAB_0040457a;
        auVar36._0_8_ = (local_260[0] + local_260[1] + local_260[2]) / 3.0;
        dVar33 = 0.0;
        lVar9 = 1;
        do {
          if (dVar33 <= ABS(adStack_2a8[lVar9 + 8] - auVar36._0_8_)) {
            dVar33 = ABS(adStack_2a8[lVar9 + 8] - auVar36._0_8_);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
        iVar5 = 1;
        if (0.0005 < dVar33) goto LAB_0040457a;
      }
      lVar9 = 0xa5;
      do {
        dVar32 = *(double *)((long)cvode_mem + lVar9 * 8 + -0x40) * auVar36._0_8_;
        dVar33 = *(double *)((long)cvode_mem + lVar9 * 8 + -0x20);
        dVar48 = auVar36._0_8_ * dVar33 * auVar36._0_8_;
        dVar34 = dVar32 - dVar48;
        if (ABS(dVar34) < adStack_5f8[lVar9] * 1e-10) goto LAB_0040457a;
        dVar48 = dVar34 - (dVar48 - *(double *)((long)cvode_mem + lVar9 * 8) * auVar36._0_8_ *
                                    auVar36._0_8_ * auVar36._0_8_);
        dVar34 = -(((*(double *)((long)cvode_mem + lVar9 * 8 + -0x60) - dVar32) - dVar34) - dVar48)
                 / dVar34;
        if ((dVar34 < 1e-10) || (4.0 < dVar34)) goto LAB_0040457a;
        adStack_768[lVar9] = dVar33 + (dVar48 / dVar34) / (auVar36._0_8_ * auVar36._0_8_);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xa8);
      if (1e-10 <= local_240[1]) {
        dVar33 = ((double)(iVar6 * iVar6 + -1) * -0.25 * (local_240[2] / local_240[1]) +
                 (local_240[0] / local_240[1]) * (local_240[2] / local_240[1]) + -1.0) *
                 (-2.0 / (double)(iVar6 + -1)) + 1.0;
        if (((1e-10 <= ABS(dVar33)) && (ABS(1.0 / dVar33 - auVar36._0_8_) <= 0.01)) &&
           (0.98 < auVar36._0_8_)) {
          iVar39 = iVar5;
          if (iVar5 == 1) {
            iVar39 = 4;
          }
          if ((iVar39 == 3) || (iVar5 == 1 || iVar39 == 2)) {
            *(int *)((long)cvode_mem + 0x124) = iVar6 + -1;
            auVar36._0_8_ = *(double *)((long)cvode_mem + 0x398);
            if (*(double *)((long)cvode_mem + 0x2f8) <= *(double *)((long)cvode_mem + 0x398)) {
              auVar36._0_8_ = *(double *)((long)cvode_mem + 0x2f8);
            }
            dVar32 = (double)((ulong)*(double *)((long)cvode_mem + 0x140) & auVar50._0_8_) *
                     *(double *)((long)cvode_mem + 0x2f0) * auVar36._0_8_;
            dVar33 = 1.0;
            if (1.0 <= dVar32) {
              dVar33 = dVar32;
            }
            *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_ / dVar33;
            *(double *)((long)cvode_mem + 0x148) =
                 (auVar36._0_8_ / dVar33) * *(double *)((long)cvode_mem + 0x140);
            *(long *)((long)cvode_mem + 0x568) = *(long *)((long)cvode_mem + 0x568) + 1;
          }
        }
      }
    }
  }
LAB_0040457a:
  *(undefined8 *)((long)cvode_mem + 0x2f8) =
       *(undefined8 *)
        ((long)cvode_mem +
        (ulong)(*(long *)((long)cvode_mem + 0x348) < *(long *)((long)cvode_mem + 0x358)) * 8 + 0x318
        );
  uStack_3f0 = 0x4045b5;
  N_VScale(*(realtype *)((long)cvode_mem + 0x1f8),*(N_Vector *)((long)cvode_mem + 0xd8),
           *(N_Vector *)((long)cvode_mem + 0xd8));
  if ((*(int *)((long)cvode_mem + 0x110) != 0) &&
     (ABS(*(double *)((long)cvode_mem + 0x168) - *(double *)((long)cvode_mem + 0x118)) <=
      (ABS(*(double *)((long)cvode_mem + 0x140)) + ABS(*(double *)((long)cvode_mem + 0x168))) *
      *(double *)((long)cvode_mem + 8) * 100.0)) {
    *(double *)((long)cvode_mem + 0x168) = *(double *)((long)cvode_mem + 0x118);
  }
  if (0 < *(int *)((long)cvode_mem + 0x578)) {
    uStack_3f0 = 0x404638;
    iVar6 = cvRcheck3((CVodeMem)cvode_mem);
    if (iVar6 == -0xc) goto LAB_00404a67;
    if (iVar6 == 1) {
      *(undefined4 *)((long)cvode_mem + 0x5d4) = 1;
      rVar28 = *(realtype *)((long)cvode_mem + 0x590);
      *local_3d0 = rVar28;
      goto LAB_00404a99;
    }
    if ((*(long *)((long)cvode_mem + 0x358) == 1) && (0 < (long)*(int *)((long)cvode_mem + 0x578)))
    {
      lVar9 = 0;
      do {
        if (*(int *)(*(long *)((long)cvode_mem + 0x5e0) + lVar9 * 4) == 0) {
          if (0 < *(int *)((long)cvode_mem + 0x5e8)) {
            uStack_3f0 = 0x4046b4;
            cvProcessError((CVodeMem)cvode_mem,99,"CVODE","CVode",
                           "At the end of the first step, there are still some root functions identically 0. This warning will not be issued again."
                          );
          }
          break;
        }
        lVar9 = lVar9 + 1;
      } while (*(int *)((long)cvode_mem + 0x578) != lVar9);
    }
  }
  if (((int)local_380 == 1) &&
     (0.0 <= (*(double *)((long)cvode_mem + 0x168) - local_3e0) *
             *(double *)((long)cvode_mem + 0x140))) {
    *local_3d0 = local_3e0;
    *(realtype *)((long)cvode_mem + 0x170) = local_3e0;
    uStack_3f0 = 0x404d9f;
    CVodeGetDky(cvode_mem,local_3e0,0,yout);
    *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x124);
    *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x148);
    return 0;
  }
  if (*(int *)((long)cvode_mem + 0x110) != 0) {
    auVar36._0_8_ = *(double *)((long)cvode_mem + 0x118);
    dVar33 = *(double *)((long)cvode_mem + 0x168);
    dVar32 = *(double *)((long)cvode_mem + 0x140);
    if (ABS(dVar33 - auVar36._0_8_) <=
        (ABS(dVar32) + ABS(dVar33)) * *(double *)((long)cvode_mem + 8) * 100.0) {
      uStack_3f0 = 0x404d69;
      CVodeGetDky(cvode_mem,auVar36._0_8_,0,yout);
      rVar28 = *(realtype *)((long)cvode_mem + 0x118);
      *local_3d0 = rVar28;
      goto LAB_004049a5;
    }
    if (0.0 < ((*(double *)((long)cvode_mem + 0x148) + dVar33) - auVar36._0_8_) * dVar32) {
      auVar36._0_8_ = (*(double *)((long)cvode_mem + 8) * -4.0 + 1.0) * (auVar36._0_8_ - dVar33);
      *(double *)((long)cvode_mem + 0x148) = auVar36._0_8_;
      *(double *)((long)cvode_mem + 0x158) = auVar36._0_8_ / dVar32;
    }
  }
  local_378 = local_378 + 1;
  if ((int)local_380 == 2) {
    rVar28 = *(realtype *)((long)cvode_mem + 0x168);
    *local_3d0 = rVar28;
    *(realtype *)((long)cvode_mem + 0x170) = rVar28;
    uStack_3f0 = 0x404d1b;
    N_VScale(1.0,*(N_Vector *)((long)cvode_mem + 0x60),yout);
    *(undefined4 *)((long)cvode_mem + 0x128) = *(undefined4 *)((long)cvode_mem + 0x124);
    *(undefined8 *)((long)cvode_mem + 0x150) = *(undefined8 *)((long)cvode_mem + 0x148);
    return 0;
  }
  goto LAB_004026ea;
}

Assistant:

int CVode(void *cvode_mem, realtype tout, N_Vector yout,
          realtype *tret, int itask)
{
  CVodeMem cv_mem;
  long int nstloc;
  int retval, hflag, kflag, istate, ir, ier, irfndp;
  int ewtsetOK;
  realtype troundoff, tout_hin, rh, nrm;
  booleantype inactive_roots;

  /*
   * -------------------------------------
   * 1. Check and process inputs
   * -------------------------------------
   */

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVode", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check if cvode_mem was allocated */
  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVode", MSGCV_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_NO_MALLOC);
  }

  /* Check for yout != NULL */
  if ((cv_mem->cv_y = yout) == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_YOUT_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for tret != NULL */
  if (tret == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_TRET_NULL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  /* Check for valid itask */
  if ( (itask != CV_NORMAL) && (itask != CV_ONE_STEP) ) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_ITASK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return(CV_ILL_INPUT);
  }

  if (itask == CV_NORMAL) cv_mem->cv_toutc = tout;
  cv_mem->cv_taskc = itask;

  /*
   * ----------------------------------------
   * 2. Initializations performed only at
   *    the first step (nst=0):
   *    - initial setup
   *    - initialize Nordsieck history array
   *    - compute initial step size
   *    - check for approach to tstop
   *    - check for approach to a root
   * ----------------------------------------
   */

  if (cv_mem->cv_nst == 0) {

    cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;

    /* Check inputs for corectness */

    ier = cvInitialSetup(cv_mem);
    if (ier != CV_SUCCESS) {
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(ier);
    }

    /* Call f at (t0,y0), set zn[1] = y'(t0). */

    retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0],
                          cv_mem->cv_zn[1], cv_mem->cv_user_data);
    cv_mem->cv_nfe++;
    if (retval < 0) {
      cvProcessError(cv_mem, CV_RHSFUNC_FAIL, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_RHSFUNC_FAIL);
    }
    if (retval > 0) {
      cvProcessError(cv_mem, CV_FIRST_RHSFUNC_ERR, "CVODE", "CVode",
                     MSGCV_RHSFUNC_FIRST);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_FIRST_RHSFUNC_ERR);
    }

    /* Test input tstop for legality. */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tstop - cv_mem->cv_tn)*(tout - cv_mem->cv_tn) <= ZERO ) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
    }

    /* Set initial h (from H0 or cvHin). */

    cv_mem->cv_h = cv_mem->cv_hin;
    if ( (cv_mem->cv_h != ZERO) && ((tout-cv_mem->cv_tn)*cv_mem->cv_h < ZERO) ) {
      cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode", MSGCV_BAD_H0);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_ILL_INPUT);
    }
    if (cv_mem->cv_h == ZERO) {
      tout_hin = tout;
      if ( cv_mem->cv_tstopset &&
           (tout-cv_mem->cv_tn)*(tout-cv_mem->cv_tstop) > ZERO )
        tout_hin = cv_mem->cv_tstop;
      hflag = cvHin(cv_mem, tout_hin);
      if (hflag != CV_SUCCESS) {
        istate = cvHandleFailure(cv_mem, hflag);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(istate);
      }
    }

    /* Enforce hmax and hmin */

    rh = SUNRabs(cv_mem->cv_h)*cv_mem->cv_hmax_inv;
    if (rh > ONE) cv_mem->cv_h /= rh;
    if (SUNRabs(cv_mem->cv_h) < cv_mem->cv_hmin)
      cv_mem->cv_h *= cv_mem->cv_hmin/SUNRabs(cv_mem->cv_h);

    /* Check for approach to tstop */

    if (cv_mem->cv_tstopset) {
      if ( (cv_mem->cv_tn + cv_mem->cv_h - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO )
        cv_mem->cv_h = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
    }

    /* Scale zn[1] by h.*/

    cv_mem->cv_hscale = cv_mem->cv_h;
    cv_mem->cv_h0u    = cv_mem->cv_h;
    cv_mem->cv_hprime = cv_mem->cv_h;

    N_VScale(cv_mem->cv_h, cv_mem->cv_zn[1], cv_mem->cv_zn[1]);

    /* Check for zeros of root function g at and near t0. */

    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck1(cv_mem);

      if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck1",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      }

    }

  } /* end of first call block */

  /*
   * ------------------------------------------------------
   * 3. At following steps, perform stop tests:
   *    - check for root in last step
   *    - check if we passed tstop
   *    - check if we passed tout (NORMAL mode)
   *    - check if current tn was returned (ONE_STEP mode)
   *    - check if we are close to tstop
   *      (adjust step size if needed)
   * -------------------------------------------------------
   */

  if (cv_mem->cv_nst > 0) {

    /* Estimate an infinitesimal time interval to be used as
       a roundoff for time quantities (based on current time
       and step size) */
    troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
      (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));

    /* First, check for a root in the last step taken, other than the
       last root found, if any.  If itask = CV_ONE_STEP and y(tn) was not
       returned because of an intervening root, return y(tn) now.     */
    if (cv_mem->cv_nrtfn > 0) {

      irfndp = cv_mem->cv_irfnd;

      retval = cvRcheck2(cv_mem);

      if (retval == CLOSERT) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "cvRcheck2",
                       MSGCV_CLOSE_ROOTS, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      } else if (retval == CV_RTFUNC_FAIL) {
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck2",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_RTFUNC_FAIL);
      } else if (retval == RTFOUND) {
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ROOT_RETURN);
      }

      /* If tn is distinct from tretlast (within roundoff),
         check remaining interval for roots */
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {

        retval = cvRcheck3(cv_mem);

        if (retval == CV_SUCCESS) {     /* no root found */
          cv_mem->cv_irfnd = 0;
          if ((irfndp == 1) && (itask == CV_ONE_STEP)) {
            cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
            N_VScale(ONE, cv_mem->cv_zn[0], yout);
            SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
            return(CV_SUCCESS);
          }
        } else if (retval == RTFOUND) {  /* a new root was found */
          cv_mem->cv_irfnd = 1;
          cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ROOT_RETURN);
        } else if (retval == CV_RTFUNC_FAIL) {  /* g failed */
          cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                         MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_RTFUNC_FAIL);
        }

      }

    } /* end of root stop check */

    /* In CV_NORMAL mode, test if tout was reached */
    if ( (itask == CV_NORMAL) && ((cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO) ) {
      cv_mem->cv_tretlast = *tret = tout;
      ier =  CVodeGetDky(cv_mem, tout, 0, yout);
      if (ier != CV_SUCCESS) {
        cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                       MSGCV_BAD_TOUT, tout);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_ILL_INPUT);
      }
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* In CV_ONE_STEP mode, test if tn was returned */
    if ( itask == CV_ONE_STEP &&
         SUNRabs(cv_mem->cv_tn - cv_mem->cv_tretlast) > troundoff ) {
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return(CV_SUCCESS);
    }

    /* Test for tn at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff ) {
        ier =  CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        if (ier != CV_SUCCESS) {
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_BAD_TSTOP, cv_mem->cv_tstop, cv_mem->cv_tn);
          SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
          return(CV_ILL_INPUT);
        }
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return(CV_TSTOP_RETURN);
      }

      /* If next step would overtake tstop, adjust stepsize */
      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

  } /* end stopping tests block */

  /*
   * --------------------------------------------------
   * 4. Looping point for internal steps
   *
   *    4.1. check for errors (too many steps, too much
   *         accuracy requested, step size too small)
   *    4.2. take a new step (call cvStep)
   *    4.3. stop on error
   *    4.4. perform stop tests:
   *         - check for root in last step
   *         - check if tout was passed
   *         - check if close to tstop
   *         - check if in ONE_STEP mode (must return)
   * --------------------------------------------------
   */

  nstloc = 0;
  for(;;) {

    cv_mem->cv_next_h = cv_mem->cv_h;
    cv_mem->cv_next_q = cv_mem->cv_q;

    /* Reset and check ewt */
    if (cv_mem->cv_nst > 0) {

      ewtsetOK = cv_mem->cv_efun(cv_mem->cv_zn[0], cv_mem->cv_ewt, cv_mem->cv_e_data);

      if (ewtsetOK != 0) {

        if (cv_mem->cv_itol == CV_WF)
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_FAIL, cv_mem->cv_tn);
        else
          cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVode",
                         MSGCV_EWT_NOW_BAD, cv_mem->cv_tn);

        istate = CV_ILL_INPUT;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
        N_VScale(ONE, cv_mem->cv_zn[0], yout);
        break;
      }
    }

    /* Check for too many steps */
    if ( (cv_mem->cv_mxstep>0) && (nstloc >= cv_mem->cv_mxstep) ) {
      cvProcessError(cv_mem, CV_TOO_MUCH_WORK, "CVODE", "CVode",
                     MSGCV_MAX_STEPS, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_WORK;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    /* Check for too much accuracy requested */
    nrm = N_VWrmsNorm(cv_mem->cv_zn[0], cv_mem->cv_ewt);
    cv_mem->cv_tolsf = cv_mem->cv_uround * nrm;
    if (cv_mem->cv_tolsf > ONE) {
      cvProcessError(cv_mem, CV_TOO_MUCH_ACC, "CVODE", "CVode",
                     MSGCV_TOO_MUCH_ACC, cv_mem->cv_tn);
      istate = CV_TOO_MUCH_ACC;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_tolsf *= TWO;
      break;
    } else {
      cv_mem->cv_tolsf = ONE;
    }

    /* Check for h below roundoff level in tn */
    if (cv_mem->cv_tn + cv_mem->cv_h == cv_mem->cv_tn) {
      cv_mem->cv_nhnil++;
      if (cv_mem->cv_nhnil <= cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL,
                       cv_mem->cv_tn, cv_mem->cv_h);
      if (cv_mem->cv_nhnil == cv_mem->cv_mxhnil)
        cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode", MSGCV_HNIL_DONE);
    }

    /* Call cvStep to take a step */
    kflag = cvStep(cv_mem);

    /* Process failed step cases, and exit loop */
    if (kflag != CV_SUCCESS) {
      istate = cvHandleFailure(cv_mem, kflag);
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      break;
    }

    nstloc++;

    /* If tstop is set and was reached, reset tn = tstop */
    if ( cv_mem->cv_tstopset ) {
      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff)
        cv_mem->cv_tn = cv_mem->cv_tstop;
    }

    /* Check for root in last step taken. */
    if (cv_mem->cv_nrtfn > 0) {

      retval = cvRcheck3(cv_mem);

      if (retval == RTFOUND) {  /* A new root was found */
        cv_mem->cv_irfnd = 1;
        istate = CV_ROOT_RETURN;
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tlo;
        break;
      } else if (retval == CV_RTFUNC_FAIL) { /* g failed */
        cvProcessError(cv_mem, CV_RTFUNC_FAIL, "CVODE", "cvRcheck3",
                       MSGCV_RTFUNC_FAILED, cv_mem->cv_tlo);
        istate = CV_RTFUNC_FAIL;
        break;
      }

      /* If we are at the end of the first step and we still have
       * some event functions that are inactive, issue a warning
       * as this may indicate a user error in the implementation
       * of the root function. */

      if (cv_mem->cv_nst==1) {
        inactive_roots = SUNFALSE;
        for (ir=0; ir<cv_mem->cv_nrtfn; ir++) {
          if (!cv_mem->cv_gactive[ir]) {
            inactive_roots = SUNTRUE;
            break;
          }
        }
        if ((cv_mem->cv_mxgnull > 0) && inactive_roots) {
          cvProcessError(cv_mem, CV_WARNING, "CVODE", "CVode",
                         MSGCV_INACTIVE_ROOTS);
        }
      }

    }

    /* In NORMAL mode, check if tout reached */
    if ( (itask == CV_NORMAL) &&  (cv_mem->cv_tn-tout)*cv_mem->cv_h >= ZERO ) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = tout;
      (void) CVodeGetDky(cv_mem, tout, 0, yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

    /* Check if tn is at tstop or near tstop */
    if ( cv_mem->cv_tstopset ) {

      troundoff = FUZZ_FACTOR * cv_mem->cv_uround *
        (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h));
      if ( SUNRabs(cv_mem->cv_tn - cv_mem->cv_tstop) <= troundoff) {
        (void) CVodeGetDky(cv_mem, cv_mem->cv_tstop, 0, yout);
        cv_mem->cv_tretlast = *tret = cv_mem->cv_tstop;
        cv_mem->cv_tstopset = SUNFALSE;
        istate = CV_TSTOP_RETURN;
        break;
      }

      if ( (cv_mem->cv_tn + cv_mem->cv_hprime - cv_mem->cv_tstop)*cv_mem->cv_h > ZERO ) {
        cv_mem->cv_hprime = (cv_mem->cv_tstop - cv_mem->cv_tn)*(ONE-FOUR*cv_mem->cv_uround);
        cv_mem->cv_eta = cv_mem->cv_hprime / cv_mem->cv_h;
      }

    }

    /* In ONE_STEP mode, copy y and exit loop */
    if (itask == CV_ONE_STEP) {
      istate = CV_SUCCESS;
      cv_mem->cv_tretlast = *tret = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], yout);
      cv_mem->cv_next_q = cv_mem->cv_qprime;
      cv_mem->cv_next_h = cv_mem->cv_hprime;
      break;
    }

  } /* end looping for internal steps */


  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return(istate);
}